

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void WebPCopyPlane(uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int width,int height)

{
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  void *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 local_24;
  undefined8 local_18;
  undefined8 local_8;
  
  local_24 = in_R9D;
  local_18 = in_RDX;
  local_8 = in_RDI;
  while (0 < local_24) {
    memcpy(local_18,local_8,(long)in_R8D);
    local_8 = (void *)((long)local_8 + (long)in_ESI);
    local_18 = (void *)((long)local_18 + (long)in_ECX);
    local_24 = local_24 + -1;
  }
  return;
}

Assistant:

void WebPCopyPlane(const uint8_t* src, int src_stride,
                   uint8_t* dst, int dst_stride, int width, int height) {
  assert(src != NULL && dst != NULL);
  assert(abs(src_stride) >= width && abs(dst_stride) >= width);
  while (height-- > 0) {
    memcpy(dst, src, width);
    src += src_stride;
    dst += dst_stride;
  }
}